

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_backend.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_posix::posix_localization_backend::posix_localization_backend
          (posix_localization_backend *this,posix_localization_backend *other)

{
  long in_RSI;
  localization_backend *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000018;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000020;
  
  localization_backend::localization_backend(in_RDI);
  in_RDI->_vptr_localization_backend = (_func_int **)&PTR__posix_localization_backend_002ebba8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_00000020,in_stack_00000018);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::string((string *)(in_RDI + 7),(string *)(in_RSI + 0x38));
  std::__cxx11::string::string((string *)(in_RDI + 0xb));
  *(undefined1 *)&in_RDI[0xf]._vptr_localization_backend = 1;
  std::shared_ptr<__locale_struct_*>::shared_ptr((shared_ptr<__locale_struct_*> *)0x29aae2);
  return;
}

Assistant:

posix_localization_backend(posix_localization_backend const &other) : 
            localization_backend(),
            paths_(other.paths_),
            domains_(other.domains_),
            locale_id_(other.locale_id_),
            invalid_(true)
        {
        }